

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

int __thiscall
notch::core::HingeLoss::clone
          (HingeLoss *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<notch::core::HingeLoss> sVar2;
  shared_ptr<notch::core::HingeLoss> c;
  _func_int **local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  SharedBuffers local_38;
  
  sVar2 = ::std::make_shared<notch::core::HingeLoss,notch::core::HingeLoss_const&>
                    ((HingeLoss *)&local_48);
  SharedBuffers::clone
            (&local_38,__fn + 8,
             sVar2.super___shared_ptr<notch::core::HingeLoss,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi,__flags,__arg);
  SharedBuffers::operator=((SharedBuffers *)(local_48 + 1),&local_38);
  SharedBuffers::~SharedBuffers(&local_38);
  _Var1._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ALossLayer)._vptr_ALossLayer = local_48;
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_48 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  return (int)this;
}

Assistant:

virtual std::shared_ptr<ALossLayer> clone() const {
        auto c = std::make_shared<HingeLoss>(*this);
        c->shared = shared.clone();
        return c;
    }